

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledArgOut_A<Js::OpLayoutDynamicProfile<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
          *playout)

{
  FunctionBody *this_00;
  code *pcVar1;
  bool bVar2;
  DynamicProfileInfo *this_01;
  undefined4 *puVar3;
  Var arg;
  Var value;
  DynamicProfileInfo *dynamicProfileInfo;
  FunctionBody *functionBody;
  OpLayoutDynamicProfile<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
  *playout_local;
  InterpreterStackFrame *this_local;
  
  this_00 = *(FunctionBody **)(this + 0x88);
  this_01 = FunctionBody::GetDynamicProfileInfo(this_00);
  if ((playout->super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).Reg < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2185,"(playout->Reg > FunctionBody::FirstRegSlot)",
                                "playout->Reg > FunctionBody::FirstRegSlot");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  arg = GetReg<unsigned_char>
                  (this,(playout->super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).Reg
                  );
  DynamicProfileInfo::RecordParameterAtCallSite
            (this_01,this_00,playout->profileId,arg,
             (uint)(playout->super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).Arg,
             (uint)(playout->super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).Reg);
  SetOut(this,(playout->super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).Arg,arg);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledArgOut_A(const unaligned T * playout)
    {
        FunctionBody* functionBody = this->m_functionBody;
        DynamicProfileInfo * dynamicProfileInfo = functionBody->GetDynamicProfileInfo();

        Assert(playout->Reg > FunctionBody::FirstRegSlot);
        Var value = GetReg(playout->Reg);
        dynamicProfileInfo->RecordParameterAtCallSite(functionBody, playout->profileId, value, playout->Arg, playout->Reg);
        SetOut(playout->Arg, value);
    }